

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test7::executeFunctionalTest(GPUShaderFP64Test7 *this,_variables *variables)

{
  uint uVar1;
  uchar *puVar2;
  char *pcVar3;
  GPUShaderFP64Test7 *this_00;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  long lVar7;
  size_t sVar8;
  _variable_type type;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  string local_1d8;
  GPUShaderFP64Test7 *local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  bVar4 = buildTestProgram(this,variables);
  if (bVar4) {
    if (this->m_are_double_inputs_supported == true) {
      setInputAttributeValues(this,variables);
    }
    configureXFBBuffer(this,variables);
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var,iVar5);
    (**(code **)(lVar7 + 0x1c0))(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glClearColor() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23df);
    (**(code **)(lVar7 + 0x188))(0x4000);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glClear() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23e2);
    (**(code **)(lVar7 + 0x1680))(this->m_po_id);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23e5);
    (**(code **)(lVar7 + 0x1a00))(0,0,this->m_to_width,this->m_to_height);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glViewport() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23ea);
    (**(code **)(lVar7 + 0x30))(4);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBeginTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23ed);
    (**(code **)(lVar7 + 0x538))(0xe,0,4);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23f0);
    (**(code **)(lVar7 + 0x638))();
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glEndTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23f3);
    (**(code **)(lVar7 + 0x1220))
              (0,0,this->m_to_width,this->m_to_height,0x1908,0x1401,this->m_to_data);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glReadPixels() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23f9);
    bVar4 = true;
    if ((ulong)this->m_to_height != 0) {
      puVar2 = this->m_to_data;
      uVar1 = this->m_to_width;
      uVar12 = 0;
      do {
        if ((ulong)uVar1 != 0) {
          uVar13 = uVar1 * 4 * (int)uVar12;
          uVar9 = 0;
          do {
            uVar10 = (ulong)(uint)((int)uVar9 * 4);
            if ((((puVar2[uVar10 + uVar13] != '\0') || (puVar2[uVar10 + (ulong)uVar13 + 1] != 0xff))
                || (puVar2[uVar10 + (ulong)uVar13 + 2] != '\0')) ||
               (puVar2[uVar10 + (ulong)uVar13 + 3] != '\0')) {
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              local_1b8 = this;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Invalid pixel found at (",0x18);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"); expected:(0, 255, 0, 0), found: (",0x24);
              std::ostream::operator<<((ostringstream *)local_1a8,(uint)puVar2[uVar10 + uVar13]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::operator<<
                        ((ostringstream *)local_1a8,(uint)puVar2[uVar10 + (ulong)uVar13 + 1]);
              this_00 = local_1b8;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::operator<<
                        ((ostringstream *)local_1a8,(uint)puVar2[uVar10 + (ulong)uVar13 + 2]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::operator<<
                        ((ostringstream *)local_1a8,(uint)puVar2[uVar10 + (ulong)uVar13 + 3]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "), with the following variable types used as varyings:",0x36);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              lVar7 = (long)(variables->
                            super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(variables->
                            super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                            )._M_impl.super__Vector_impl_data._M_start;
              if (lVar7 != 0) {
                lVar7 = (lVar7 >> 2) * -0x5555555555555555;
                lVar14 = 0;
                lVar11 = 0;
                do {
                  local_1b0 = (undefined1  [8])
                              ((this_00->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                              m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"gs_variable",0xb);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": ",2);
                  Utils::getVariableTypeString_abi_cxx11_
                            (&local_1d8,
                             (Utils *)(ulong)*(uint *)((long)&((variables->
                                                                                                                              
                                                  super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->type
                                                  + lVar14),type);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,
                             local_1d8._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," (array size:",0xd);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                    operator_delete(local_1d8._M_dataplus._M_p,
                                    local_1d8.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                  lVar11 = lVar11 + 1;
                  lVar14 = lVar14 + 0xc;
                } while (lVar7 + (ulong)(lVar7 == 0) != lVar11);
              }
              logVariableContents(this_00,variables);
              local_1b0 = (undefined1  [8])
                          ((this_00->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
              ;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Shaders used:\n\n(VS):\n",0x15);
              pcVar3 = (this_00->m_current_vs_body)._M_dataplus._M_p;
              iVar5 = (int)(ostringstream *)local_1a8;
              if (pcVar3 == (char *)0x0) {
                std::ios::clear(iVar5 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
              }
              else {
                sVar8 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar3,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(TC):\n\n",7)
              ;
              pcVar3 = (this_00->m_current_tc_body)._M_dataplus._M_p;
              if (pcVar3 == (char *)0x0) {
                std::ios::clear(iVar5 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
              }
              else {
                sVar8 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar3,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"\n(TE):\n\n",8);
              pcVar3 = (this_00->m_current_te_body)._M_dataplus._M_p;
              if (pcVar3 == (char *)0x0) {
                std::ios::clear(iVar5 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
              }
              else {
                sVar8 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar3,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n(GS):\n",7)
              ;
              pcVar3 = (this_00->m_current_gs_body)._M_dataplus._M_p;
              if (pcVar3 == (char *)0x0) {
                std::ios::clear(iVar5 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
              }
              else {
                sVar8 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar3,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"\n(FS):\n\n",8);
              pcVar3 = (this_00->m_current_fs_body)._M_dataplus._M_p;
              if (pcVar3 == (char *)0x0) {
                std::ios::clear(iVar5 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
              }
              else {
                sVar8 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar3,sVar8);
              }
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              goto LAB_00936138;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar1);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != this->m_to_height);
    }
  }
  else {
LAB_00936138:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool GPUShaderFP64Test7::executeFunctionalTest(_variables& variables)
{
	bool result = true;

	/* Build the test program */
	if (!buildTestProgram(variables))
	{
		return false;
	}

	/* Set up input attributes if GL_ARB_vertex_attrib_64bit extension is supported */
	if (m_are_double_inputs_supported)
	{
		setInputAttributeValues(variables);
	}

	/* Set up buffer object to hold XFB data. The data will be used for logging purposes
	 * only, if a data mismatch is detected.
	 */
	configureXFBBuffer(variables);

	/* Issue a draw call using the test program */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.clearColor(1.0f, 1.0f, 1.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.viewport(0, /* x */
				0, /* y */
				m_to_width, m_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");

	gl.beginTransformFeedback(GL_TRIANGLES);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
	{
		gl.drawArrays(GL_PATCHES, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

	/* Verify color attachment contents */
	const float epsilon = 1.0f / 255.0f;

	gl.readPixels(0 /* x */, 0 /* y */, m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, m_to_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

	for (unsigned int y = 0; y < m_to_height; ++y)
	{
		const unsigned char* row_ptr = m_to_data + 4 /* rgba */ * m_to_width * y;

		for (unsigned int x = 0; x < m_to_width; ++x)
		{
			const unsigned char* pixel_ptr = row_ptr + 4 /* rgba */ * x;

			if (de::abs(pixel_ptr[0]) > epsilon || de::abs(pixel_ptr[1] - 255) > epsilon ||
				de::abs(pixel_ptr[2]) > epsilon || de::abs(pixel_ptr[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixel found at (" << x << ", " << y
								   << ")"
									  "; expected:(0, 255, 0, 0), found: ("
								   << (int)pixel_ptr[0] << ", " << (int)pixel_ptr[1] << ", " << (int)pixel_ptr[2]
								   << ", " << (int)pixel_ptr[3]
								   << "), with the following variable types used as varyings:"
								   << tcu::TestLog::EndMessage;

				/* List the variable types that failed the test */
				const size_t n_variables = variables.size();

				for (size_t n_variable = 0; n_variable < n_variables; ++n_variable)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "gs_variable" << n_variable << ": "
									   << Utils::getVariableTypeString(variables[n_variable].type)
									   << " (array size:" << variables[n_variable].array_size << ")"
									   << tcu::TestLog::EndMessage;
				} /* for (all variable types) */

				/* Log the variable contents */
				logVariableContents(variables);

				/* Log shaders used for the iteration */
				m_testCtx.getLog() << tcu::TestLog::Message << "Shaders used:\n"
															   "\n"
															   "(VS):\n"
								   << m_current_vs_body.c_str() << "\n"
								   << "(TC):\n"
									  "\n"
								   << m_current_tc_body.c_str() << "\n"
																   "(TE):\n"
																   "\n"
								   << m_current_te_body.c_str() << "\n"
																   "(GS):\n"
								   << m_current_gs_body.c_str() << "\n"
																   "(FS):\n"
																   "\n"
								   << m_current_fs_body.c_str() << tcu::TestLog::EndMessage;

				result = false;

				goto end;
			}
		} /* for (all columns) */
	}	 /* for (all rows) */

/* All done! */
end:
	return result;
}